

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

bool vkt::pipeline::anon_unknown_0::validateResultImage<tcu::Texture2DView>
               (Texture2DView *texture,Sampler *sampler,ConstPixelBufferAccess *texCoords,
               Vec2 *lodBounds,LookupPrecision *lookupPrecision,Vec4 *lookupScale,Vec4 *lookupBias,
               ConstPixelBufferAccess *result,PixelBufferAccess *errorMask)

{
  int iVar1;
  int iVar2;
  float local_b4;
  float local_a4;
  Vector<float,_4> local_a0;
  byte local_8d;
  undefined1 local_8c [7];
  bool pixelOk;
  Vec4 texCoord;
  undefined1 local_6c [8];
  Vec4 resultColor;
  Vec4 resultPixel;
  int x;
  int y;
  bool allOk;
  int h;
  int w;
  Vec4 *lookupScale_local;
  LookupPrecision *lookupPrecision_local;
  Vec2 *lodBounds_local;
  ConstPixelBufferAccess *texCoords_local;
  Sampler *sampler_local;
  Texture2DView *texture_local;
  
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(result);
  x._3_1_ = true;
  for (resultPixel.m_data[3] = 0.0; (int)resultPixel.m_data[3] < iVar2;
      resultPixel.m_data[3] = (float)((int)resultPixel.m_data[3] + 1)) {
    for (resultPixel.m_data[2] = 0.0; (int)resultPixel.m_data[2] < iVar1;
        resultPixel.m_data[2] = (float)((int)resultPixel.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(resultColor.m_data + 2),(int)result,
                 (int)resultPixel.m_data[2],(int)resultPixel.m_data[3]);
      tcu::operator-((tcu *)(texCoord.m_data + 2),(Vector<float,_4> *)(resultColor.m_data + 2),
                     lookupBias);
      tcu::operator/((tcu *)local_6c,(Vector<float,_4> *)(texCoord.m_data + 2),lookupScale);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_8c,(int)texCoords,(int)resultPixel.m_data[2],
                 (int)resultPixel.m_data[3]);
      local_8d = isLookupResultValid(texture,sampler,lookupPrecision,(Vec4 *)local_8c,lodBounds,
                                     (Vec4 *)local_6c);
      local_a4 = 0.0;
      if (!(bool)local_8d) {
        local_a4 = 1.0;
      }
      local_b4 = 1.0;
      if (!(bool)local_8d) {
        local_b4 = 0.0;
      }
      tcu::Vector<float,_4>::Vector(&local_a0,local_a4,local_b4,0.0,1.0);
      tcu::PixelBufferAccess::setPixel
                (errorMask,&local_a0,(int)resultPixel.m_data[2],(int)resultPixel.m_data[3],0);
      if ((local_8d & 1) == 0) {
        x._3_1_ = false;
      }
    }
  }
  return x._3_1_;
}

Assistant:

bool validateResultImage (const TextureViewType&				texture,
						  const tcu::Sampler&					sampler,
						  const tcu::ConstPixelBufferAccess&	texCoords,
						  const tcu::Vec2&						lodBounds,
						  const tcu::LookupPrecision&			lookupPrecision,
						  const tcu::Vec4&						lookupScale,
						  const tcu::Vec4&						lookupBias,
						  const tcu::ConstPixelBufferAccess&	result,
						  const tcu::PixelBufferAccess&			errorMask)
{
	const int	w		= result.getWidth();
	const int	h		= result.getHeight();
	bool		allOk	= true;

	for (int y = 0; y < h; ++y)
	{
		for (int x = 0; x < w; ++x)
		{
			const tcu::Vec4		resultPixel	= result.getPixel(x, y);
			const tcu::Vec4		resultColor	= (resultPixel - lookupBias) / lookupScale;
			const tcu::Vec4		texCoord	= texCoords.getPixel(x, y);
			const bool			pixelOk		= isLookupResultValid(texture, sampler, lookupPrecision, texCoord, lodBounds, resultColor);

			errorMask.setPixel(tcu::Vec4(pixelOk?0.0f:1.0f, pixelOk?1.0f:0.0f, 0.0f, 1.0f), x, y);

			if (!pixelOk)
				allOk = false;
		}
	}

	return allOk;
}